

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O1

Gia_Man_t * Bmc_EcoMiter(Gia_Man_t *pGold,Gia_Man_t *pOld,Vec_Int_t *vFans)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  char *__s;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *__dest;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint local_48;
  
  iVar6 = pOld->vCos->nSize;
  uVar15 = ~pOld->nRegs + iVar6;
  if (((int)uVar15 < 0) || (iVar6 <= (int)uVar15)) {
LAB_0052ef84:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar7 = pOld->vCos->pArray[uVar15];
  if (((long)iVar7 < 0) || (pOld->nObjs <= iVar7)) {
LAB_0052ef27:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (pGold->vCis->nSize != pOld->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x36,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  if (pGold->vCos->nSize != iVar6 + -1) {
    __assert_fail("Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x37,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  pGVar1 = pOld->pObjs + iVar7 + -(ulong)((uint)*(undefined8 *)(pOld->pObjs + iVar7) & 0x1fffffff);
  if (((int)(uint)*(ulong *)pGVar1 < 0) || (((uint)*(ulong *)pGVar1 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x38,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  p = Gia_ManStart(pGold->nObjs * 3);
  __s = pGold->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashAlloc(p);
  pGold->pObjs->Value = 0;
  pVVar11 = pGold->vCis;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      iVar6 = pVVar11->pArray[lVar14];
      if (((long)iVar6 < 0) || (pGold->nObjs <= iVar6)) goto LAB_0052ef27;
      pGVar13 = pGold->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p);
      uVar3 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar10 = p->pObjs;
      if ((pGVar9 < pGVar10) || (pGVar10 + p->nObjs <= pGVar9)) goto LAB_0052ef65;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * -0x55555555);
      pGVar10 = p->pObjs;
      if ((pGVar9 < pGVar10) || (pGVar10 + p->nObjs <= pGVar9)) goto LAB_0052ef65;
      pGVar13[iVar6].Value = (int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar11 = pGold->vCis;
    } while (lVar14 < pVVar11->nSize);
  }
  pGVar10 = Gia_ManAppendObj(p);
  uVar3 = *(ulong *)pGVar10;
  *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
  *(ulong *)pGVar10 =
       uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar13 = p->pObjs;
  if ((pGVar13 <= pGVar10) && (pGVar10 < pGVar13 + p->nObjs)) {
    Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * -0x55555555);
    pGVar13 = p->pObjs;
    if ((pGVar13 <= pGVar10) && (pGVar10 < pGVar13 + p->nObjs)) {
      iVar6 = pGold->nObjs;
      if ((0 < iVar6) && (pGVar9 = pGold->pObjs, pGVar9 != (Gia_Obj_t *)0x0)) {
        lVar14 = 0;
        do {
          uVar3 = *(ulong *)pGVar9;
          if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
            if ((int)pGVar9[-(uVar3 & 0x1fffffff)].Value < 0) goto LAB_0052ef46;
            uVar15 = (uint)(uVar3 >> 0x20);
            if ((int)pGVar9[-(ulong)(uVar15 & 0x1fffffff)].Value < 0) goto LAB_0052ef46;
            uVar15 = Gia_ManHashAnd(p,pGVar9[-(uVar3 & 0x1fffffff)].Value ^
                                      (uint)(uVar3 >> 0x1d) & 1,
                                    pGVar9[-(ulong)(uVar15 & 0x1fffffff)].Value ^ uVar15 >> 0x1d & 1
                                   );
            pGVar9->Value = uVar15;
          }
          lVar14 = lVar14 + 1;
          iVar6 = pGold->nObjs;
        } while ((lVar14 < iVar6) &&
                (pGVar9 = pGold->pObjs + lVar14, pGold->pObjs != (Gia_Obj_t *)0x0));
      }
      lVar14 = (long)pGold->vCos->nSize;
      if (0 < lVar14) {
        piVar4 = pGold->vCos->pArray;
        lVar16 = 0;
        do {
          iVar7 = piVar4[lVar16];
          if (((long)iVar7 < 0) || (iVar6 <= iVar7)) goto LAB_0052ef27;
          if (pGold->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar9 = pGold->pObjs + iVar7;
          if ((int)pGVar9[-(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)].Value < 0)
          goto LAB_0052ef46;
          pGVar9->Value =
               (uint)*(undefined8 *)pGVar9 >> 0x1d & 1 ^
               pGVar9[-(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)].Value;
          lVar16 = lVar16 + 1;
        } while (lVar14 != lVar16);
      }
      pGVar9 = pOld->pObjs;
      pGVar9->Value = 0;
      lVar14 = (long)pOld->vCis->nSize;
      if (0 < lVar14) {
        piVar4 = pOld->vCis->pArray;
        lVar16 = 0;
        do {
          iVar7 = piVar4[lVar16];
          if (((long)iVar7 < 0) || (pOld->nObjs <= iVar7)) goto LAB_0052ef27;
          if (pGVar9 == (Gia_Obj_t *)0x0) break;
          if (pGold->vCis->nSize <= lVar16) goto LAB_0052ef84;
          iVar2 = pGold->vCis->pArray[lVar16];
          if (((long)iVar2 < 0) || (iVar6 <= iVar2)) goto LAB_0052ef27;
          pGVar9[iVar7].Value = pGold->pObjs[iVar2].Value;
          lVar16 = lVar16 + 1;
        } while (lVar14 != lVar16);
      }
      uVar15 = (int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * 0x55555556;
      iVar6 = pOld->nObjs;
      if ((0 < iVar6) && (pGVar13 = pOld->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
        lVar14 = 0;
        do {
          uVar3 = *(ulong *)pGVar13;
          if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
            uVar5 = uVar15;
            if (pGVar13 != pGVar1) {
              if ((int)pGVar13[-(uVar3 & 0x1fffffff)].Value < 0) goto LAB_0052ef46;
              uVar5 = (uint)(uVar3 >> 0x20);
              if ((int)pGVar13[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_0052ef46;
              uVar5 = Gia_ManHashAnd(p,pGVar13[-(uVar3 & 0x1fffffff)].Value ^
                                       (uint)(uVar3 >> 0x1d) & 1,
                                     pGVar13[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1
                                    );
            }
            pGVar13->Value = uVar5;
          }
          lVar14 = lVar14 + 1;
          iVar6 = pOld->nObjs;
        } while ((lVar14 < iVar6) &&
                (pGVar13 = pOld->pObjs + lVar14, pOld->pObjs != (Gia_Obj_t *)0x0));
      }
      lVar14 = (long)pOld->vCos->nSize;
      if (0 < lVar14) {
        piVar4 = pOld->vCos->pArray;
        lVar16 = 0;
        do {
          iVar7 = piVar4[lVar16];
          if (((long)iVar7 < 0) || (iVar6 <= iVar7)) goto LAB_0052ef27;
          if (pOld->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar13 = pOld->pObjs + iVar7;
          if ((int)pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value < 0)
          goto LAB_0052ef46;
          pGVar13->Value =
               (uint)*(undefined8 *)pGVar13 >> 0x1d & 1 ^
               pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value;
          lVar16 = lVar16 + 1;
        } while (lVar14 != lVar16);
      }
      pVVar11 = pGold->vCos;
      if (0 < pVVar11->nSize) {
        lVar14 = 0;
        do {
          iVar6 = pVVar11->pArray[lVar14];
          if (((long)iVar6 < 0) || (pGold->nObjs <= iVar6)) goto LAB_0052ef27;
          if (pGold->pObjs == (Gia_Obj_t *)0x0) break;
          if (pOld->vCos->nSize <= lVar14) goto LAB_0052ef84;
          iVar7 = pOld->vCos->pArray[lVar14];
          if (((long)iVar7 < 0) || (pOld->nObjs <= iVar7)) goto LAB_0052ef27;
          iVar6 = Gia_ManHashXor(p,pGold->pObjs[iVar6].Value,pOld->pObjs[iVar7].Value);
          Gia_ManAppendCo(p,iVar6);
          lVar14 = lVar14 + 1;
          pVVar11 = pGold->vCos;
        } while (lVar14 < pVVar11->nSize);
      }
      iVar6 = pOld->nObjs;
      if ((0 < iVar6) && (pGVar13 = pOld->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
        local_48 = uVar15 | 1;
        lVar14 = 0;
        do {
          uVar3 = *(ulong *)pGVar13;
          if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
            if (pGVar13 == pGVar1) {
              uVar5 = local_48;
              if ((int)uVar15 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf4,"int Abc_LitNot(int)");
              }
            }
            else {
              if ((int)pGVar13[-(uVar3 & 0x1fffffff)].Value < 0) goto LAB_0052ef46;
              uVar5 = (uint)(uVar3 >> 0x20);
              if ((int)pGVar13[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_0052ef46;
              uVar5 = Gia_ManHashAnd(p,pGVar13[-(uVar3 & 0x1fffffff)].Value ^
                                       (uint)(uVar3 >> 0x1d) & 1,
                                     pGVar13[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1
                                    );
            }
            pGVar13->Value = uVar5;
          }
          lVar14 = lVar14 + 1;
          iVar6 = pOld->nObjs;
        } while ((lVar14 < iVar6) &&
                (pGVar13 = pOld->pObjs + lVar14, pOld->pObjs != (Gia_Obj_t *)0x0));
      }
      lVar14 = (long)pOld->vCos->nSize;
      if (0 < lVar14) {
        piVar4 = pOld->vCos->pArray;
        lVar16 = 0;
        do {
          iVar7 = piVar4[lVar16];
          if (((long)iVar7 < 0) || (iVar6 <= iVar7)) goto LAB_0052ef27;
          if (pOld->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar1 = pOld->pObjs + iVar7;
          if ((int)pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value < 0) {
LAB_0052ef46:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          pGVar1->Value =
               (uint)*(undefined8 *)pGVar1 >> 0x1d & 1 ^
               pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value;
          lVar16 = lVar16 + 1;
        } while (lVar14 != lVar16);
      }
      pVVar11 = pGold->vCos;
      if (pVVar11->nSize < 1) {
        iVar6 = 0;
      }
      else {
        lVar14 = 0;
        iVar6 = 0;
        do {
          iVar7 = pVVar11->pArray[lVar14];
          if (((long)iVar7 < 0) || (pGold->nObjs <= iVar7)) goto LAB_0052ef27;
          if (pGold->pObjs == (Gia_Obj_t *)0x0) break;
          if (pOld->vCos->nSize <= lVar14) goto LAB_0052ef84;
          iVar2 = pOld->vCos->pArray[lVar14];
          if (((long)iVar2 < 0) || (pOld->nObjs <= iVar2)) goto LAB_0052ef27;
          iVar7 = Gia_ManHashXor(p,pGold->pObjs[iVar7].Value,pOld->pObjs[iVar2].Value);
          iVar6 = Gia_ManHashOr(p,iVar6,iVar7);
          lVar14 = lVar14 + 1;
          pVVar11 = pGold->vCos;
        } while (lVar14 < pVVar11->nSize);
      }
      Gia_ManAppendCo(p,iVar6);
      if (0 < vFans->nSize) {
        lVar14 = 0;
        do {
          iVar6 = vFans->pArray[lVar14];
          if (((long)iVar6 < 0) || (pOld->nObjs <= iVar6)) goto LAB_0052ef27;
          if (pOld->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p,pOld->pObjs[iVar6].Value);
          lVar14 = lVar14 + 1;
        } while (lVar14 < vFans->nSize);
      }
      pGVar12 = Gia_ManCleanup(p);
      Gia_ManStop(p);
      if (pGVar12->vCis->nSize - pGVar12->nRegs != pGold->vCis->nSize + 1) {
        __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0x65,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
      }
      if (pGVar12->vCos->nSize - pGVar12->nRegs != pGold->vCos->nSize + vFans->nSize + 1) {
        __assert_fail("Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0x66,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
      }
      return pGVar12;
    }
  }
LAB_0052ef65:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes miter for ECO with given root node and fanins.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Bmc_EcoMiter( Gia_Man_t * pGold, Gia_Man_t * pOld, Vec_Int_t * vFans )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pRoot = Gia_ObjFanin0( Gia_ManPo(pOld, Gia_ManPoNum(pOld)-1) ); // fanin of the last PO
    Gia_Obj_t * pObj;
    int i, NewPi, Miter;
    assert( Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld) );
    assert( Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1 );
    assert( Gia_ObjIsAnd(pRoot) );
    // create the miter
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGold) );
    pNew->pName = Abc_UtilStrsav( pGold->pName );
    Gia_ManHashAlloc( pNew );
    // copy gold
    Gia_ManConst0(pGold)->Value = 0;
    Gia_ManForEachCi( pGold, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    NewPi = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( pGold, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pGold, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    // create onset
    Gia_ManConst0(pOld)->Value = 0;
    Gia_ManForEachCi( pOld, pObj, i )
        pObj->Value = Gia_ManCi(pGold, i)->Value;
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = NewPi;
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Gia_ManForEachCo( pGold, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    // create offset
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = Abc_LitNot(NewPi);
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Miter = 0;
    Gia_ManForEachCo( pGold, pObj, i )
        Miter = Gia_ManHashOr( pNew, Miter, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    Gia_ManAppendCo( pNew, Miter );
    // add outputs for the nodes
    Gia_ManForEachObjVec( vFans, pOld, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1 );
    assert( Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans) );
    return pNew;
}